

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

void binbuf_restore(_binbuf *x,int argc,t_atom *argv)

{
  char cVar1;
  int iVar2;
  char *__s;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  int iVar6;
  char *pcVar7;
  word wVar8;
  long lVar9;
  char *pcVar10;
  t_atom *ptVar11;
  int dollar;
  char buf [1000];
  t_float local_41c;
  char local_418 [1000];
  
  iVar2 = x->b_n;
  iVar6 = binbuf_resize(x,iVar2 + argc);
  if (iVar6 == 0) {
    pd_error((void *)0x0,"binbuf_restore: out of space");
    return;
  }
  if (argc != 0) {
    ptVar11 = x->b_vec + iVar2;
    do {
      if (argv->a_type == A_SYMBOL) {
        __s = ((argv->a_w).w_symbol)->s_name;
        cVar1 = *__s;
        pcVar10 = __s;
        if (cVar1 == ',') {
          if (__s[1] == '\0') {
            ptVar11->a_type = A_COMMA;
            goto LAB_001686c1;
          }
LAB_0016860d:
          pcVar7 = strchr(__s,0x5c);
          if (pcVar7 == (char *)0x0) goto LAB_001686ed;
LAB_00168649:
          bVar3 = false;
          pcVar10 = local_418;
          bVar4 = false;
          lVar9 = 0;
          pcVar7 = __s;
          do {
            pcVar7 = pcVar7 + 1;
            if (bVar3) {
LAB_0016867e:
              lVar9 = lVar9 + 1;
              *pcVar10 = cVar1;
              bVar3 = false;
            }
            else {
              if (cVar1 != '\\') {
                if ((cVar1 == '$') && ((byte)(*pcVar7 - 0x30U) < 10)) {
                  bVar4 = true;
                }
                goto LAB_0016867e;
              }
              bVar3 = true;
            }
            pcVar10 = local_418 + lVar9;
            cVar1 = *pcVar7;
          } while ((cVar1 != '\0') && (lVar9 < 999));
          *pcVar10 = '\0';
          pcVar10 = local_418;
          if (!bVar4) goto LAB_001686d1;
LAB_00168708:
          pcVar7 = pcVar10;
          if (*pcVar10 == '$') {
            do {
              cVar1 = pcVar7[1];
              if (cVar1 == '\0') {
                local_41c = 0.0;
                __isoc99_sscanf(pcVar10 + 1,"%d",&local_41c);
                ptVar11->a_type = A_DOLLAR;
                (ptVar11->a_w).w_float = local_41c;
                goto LAB_0016874b;
              }
              pcVar7 = pcVar7 + 1;
            } while (0xf5 < (byte)(cVar1 - 0x3aU));
          }
          ptVar11->a_type = A_DOLLSYM;
          if (pcVar10 != __s) goto LAB_00168733;
LAB_00168742:
          wVar8 = argv->a_w;
        }
        else {
          if (cVar1 == ';') {
            if (__s[1] != '\0') goto LAB_0016860d;
            ptVar11->a_type = A_SEMI;
LAB_001686c1:
            (ptVar11->a_w).w_float = 0.0;
            goto LAB_0016874b;
          }
          pcVar7 = strchr(__s,0x5c);
          if (pcVar7 == (char *)0x0) {
LAB_001686ed:
            pcVar7 = strchr(pcVar10,0x24);
            if ((pcVar7 != (char *)0x0) && ((byte)(pcVar7[1] - 0x30U) < 10)) goto LAB_00168708;
            ptVar11->a_type = A_SYMBOL;
            goto LAB_00168742;
          }
          if (cVar1 != '\0') goto LAB_00168649;
          local_418[0] = '\0';
LAB_001686d1:
          pcVar10 = local_418;
          if (local_418 == __s) goto LAB_001686ed;
          ptVar11->a_type = A_SYMBOL;
          pcVar10 = local_418;
LAB_00168733:
          wVar8.w_symbol = gensym(pcVar10);
        }
        (ptVar11->a_w).w_symbol = (t_symbol *)wVar8;
      }
      else {
        uVar5 = *(undefined4 *)&argv->field_0x4;
        wVar8 = argv->a_w;
        ptVar11->a_type = argv->a_type;
        *(undefined4 *)&ptVar11->field_0x4 = uVar5;
        ptVar11->a_w = wVar8;
      }
LAB_0016874b:
      argc = argc + -1;
      argv = argv + 1;
      ptVar11 = ptVar11 + 1;
    } while (argc != 0);
  }
  return;
}

Assistant:

void binbuf_restore(t_binbuf *x, int argc, const t_atom *argv)
{
    int previoussize = x->b_n;
    int newsize = previoussize + argc, i;
    t_atom *ap;

    if (!binbuf_resize(x, newsize))
    {
        pd_error(0, "binbuf_restore: out of space");
        return;
    }

    for (ap = x->b_vec + previoussize, i = argc; i--; ap++)
    {
        if (argv->a_type == A_SYMBOL)
        {
            const char *str = argv->a_w.w_symbol->s_name, *str2;
            if (!strcmp(str, ";")) SETSEMI(ap);
            else if (!strcmp(str, ",")) SETCOMMA(ap);
            else
            {
                char buf[MAXPDSTRING], *sp1;
                const char *sp2, *usestr;
                int dollar = 0;
                if (strchr(str, '\\'))
                {
                    int slashed = 0;
                    for (sp1 = buf, sp2 = argv->a_w.w_symbol->s_name;
                        *sp2 && sp1 < buf + (MAXPDSTRING-1);
                            sp2++)
                    {
                        if (slashed)
                            *sp1++ = *sp2, slashed = 0;
                        else if (*sp2 == '\\')
                            slashed = 1;
                        else
                        {
                            if (*sp2 == '$' && sp2[1] >= '0' && sp2[1] <= '9')
                                dollar = 1;
                            *sp1++ = *sp2;
                            slashed = 0;
                        }
                    }
                    *sp1 = 0;
                    usestr = buf;
                }
                else usestr = str;
                if (dollar || (usestr== str && (str2 = strchr(usestr, '$')) &&
                    str2[1] >= '0' && str2[1] <= '9'))
                {
                    int dollsym = 0;
                    if (*usestr != '$')
                        dollsym = 1;
                    else for (str2 = usestr + 1; *str2; str2++)
                        if (*str2 < '0' || *str2 > '9')
                    {
                        dollsym = 1;
                        break;
                    }
                    if (dollsym)
                        SETDOLLSYM(ap, usestr == str ?
                            argv->a_w.w_symbol : gensym(usestr));
                    else
                    {
                        int dollar = 0;
                        sscanf(usestr + 1, "%d", &dollar);
                        SETDOLLAR(ap, dollar);
                    }
                }
                else SETSYMBOL(ap, usestr == str ?
                    argv->a_w.w_symbol : gensym(usestr));
                /* fprintf(stderr, "arg %s -> binbuf %s type %d\n",
                    argv->a_w.w_symbol->s_name, usestr, ap->a_type); */
            }
            argv++;
        }
        else *ap = *(argv++);
    }
}